

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArrayDimensionFunction::checkArguments
          (ArrayDimensionFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *context_00;
  reference ppEVar2;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 isMethod;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Type *type;
  Compilation *comp;
  Type *pTVar3;
  Diagnostic *this_01;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  DiagCode code;
  ASTContext *context_01;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  context_01 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x91a34f);
  pTVar3 = (Type *)0x1;
  this_01 = (Diagnostic *)0x1;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,context_01,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    context_00 = not_null<const_slang::ast::Type_*>::operator*
                           ((not_null<const_slang::ast::Type_*> *)0x91a3d4);
    bVar1 = Type::isIntegral((Type *)this_01);
    if (((!bVar1) && (bVar1 = Type::isUnpackedArray(pTVar3), !bVar1)) &&
       (bVar1 = Type::isString((Type *)0x91a3ff), !bVar1)) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      pTVar3 = SystemSubroutine::badArg
                         (in_RCX,(ASTContext *)context_00,
                          (Expression *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      return pTVar3;
    }
    bVar1 = Type::hasFixedRange((Type *)this_01);
    if ((!bVar1) &&
       (ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (in_RDX,0), (*ppEVar2)->kind == DataType)) {
      code.subsystem = SysFuncs;
      code.code = 0x21;
      ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,0);
      ASTContext::addDiag(in_RDI,code,(*ppEVar2)->sourceRange);
      Diagnostic::operator<<(this_01,(string *)pTVar3);
      pTVar3 = Compilation::getErrorType(this_00);
      return pTVar3;
    }
    pTVar3 = Compilation::getIntegerType(this_00);
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        if (!type.isIntegral() && !type.isUnpackedArray() && !type.isString())
            return badArg(context, *args[0]);

        // Spec says we have to disallow this case.
        if (!type.hasFixedRange() && args[0]->kind == ExpressionKind::DataType) {
            context.addDiag(diag::QueryOnDynamicType, args[0]->sourceRange) << name;
            return comp.getErrorType();
        }

        return comp.getIntegerType();
    }